

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_add_passphrase.c
# Opt level: O2

void test_archive_read_add_passphrase_incorrect_sequance(void)

{
  int iVar1;
  archive_read *a;
  char *v2;
  
  a = (archive_read *)archive_read_new();
  iVar1 = archive_read_add_passphrase((archive *)a,"pass1");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_add_passphrase.c"
                      ,L'?',0,"ARCHIVE_OK",(long)iVar1,"archive_read_add_passphrase(a, \"pass1\")",
                      (void *)0x0);
  v2 = __archive_read_next_passphrase(a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_add_passphrase.c"
             ,L'C',(char *)0x0,"NULL",v2,"__archive_read_next_passphrase(ar)",(void *)0x0,L'\0');
  archive_read_free((archive *)a);
  return;
}

Assistant:

DEFINE_TEST(test_archive_read_add_passphrase_incorrect_sequance)
{
	struct archive* a = archive_read_new();
	struct archive_read *ar = (struct archive_read *)a;

	assertEqualInt(ARCHIVE_OK, archive_read_add_passphrase(a, "pass1"));

	/* No call of __archive_read_reset_passphrase() leads to
	 * get NULL even if a user has passed a passphrases. */
	assertEqualString(NULL, __archive_read_next_passphrase(ar));

	archive_read_free(a);
}